

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_insert
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  int iVar1;
  REF_NODE ref_node;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  int iVar6;
  REF_STATUS RVar7;
  REF_INT *pRVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  REF_CELL pRVar16;
  REF_CELL pRVar17;
  long lVar18;
  bool bVar19;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  int local_70;
  int local_6c;
  REF_CELL local_68;
  int local_5c;
  int local_58;
  REF_INT local_54;
  long local_50;
  REF_INT local_48;
  int local_44 [3];
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = ref_node->ref_mpi->id;
  if ((iVar1 != ref_node->part[node]) || (lVar12 = (long)site, iVar1 != ref_node->part[lVar12])) {
LAB_00197ceb:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
    return 0;
  }
  if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return 0;
  }
  if (-1 < site) {
    pRVar17 = ref_grid->cell[3];
    pRVar2 = pRVar17->ref_adj;
    if ((site < pRVar2->nnode) &&
       (pRVar16 = (REF_CELL)(long)pRVar2->first[lVar12], pRVar16 != (REF_CELL)0xffffffffffffffff)) {
      pRVar3 = pRVar2->item + (long)pRVar16;
      local_50 = CONCAT44(local_50._4_4_,faceid);
      local_48 = site;
      local_38 = lVar12;
      do {
        iVar1 = pRVar3->ref;
        lVar12 = (long)iVar1;
        iVar6 = pRVar17->node_per;
        if (iVar6 < 1) {
LAB_0019797b:
          if ((faceid == -1) || (pRVar17->c2n[pRVar17->size_per * iVar1 + iVar6] == faceid)) {
            local_68 = pRVar16;
            uVar5 = ref_list_contains(ref_cavity->tri_list,iVar1,&local_6c);
            if (uVar5 != 0) {
              pcVar15 = "have tet?";
              uVar10 = 0x39d;
              goto LAB_00197f9c;
            }
            if (local_6c != 0) {
              pcVar15 = "added tri twice?";
              uVar10 = 0x39e;
              goto LAB_00197ed1;
            }
            uVar5 = ref_list_push(ref_cavity->tri_list,iVar1);
            if (uVar5 != 0) {
              pcVar15 = "save tri";
              uVar10 = 0x39f;
              goto LAB_00197f9c;
            }
            uVar5 = ref_cell_all_local(pRVar17,ref_node,iVar1,&local_70);
            if (uVar5 != 0) {
              pcVar15 = "local cell";
              uVar10 = 0x3a0;
              goto LAB_00197f9c;
            }
            if (local_70 == 0) goto LAB_00197ceb;
            pRVar8 = pRVar17->c2n;
            lVar18 = pRVar17->size_per * lVar12;
            local_54 = pRVar8[(long)(int)lVar18 + (long)pRVar17->node_per];
            local_5c = pRVar8[lVar18 + 1];
            local_58 = pRVar8[lVar18 + 2];
            if (local_58 != node && local_5c != node) {
              uVar5 = ref_cavity_insert_seg(ref_cavity,&local_5c);
              if (uVar5 != 0) {
                pcVar15 = "tri side";
                uVar10 = 0x3ab;
                goto LAB_00197f9c;
              }
              pRVar8 = pRVar17->c2n;
              lVar18 = pRVar17->size_per * lVar12;
            }
            local_5c = pRVar8[lVar18 + 2];
            local_58 = pRVar8[lVar18];
            if (local_58 != node && local_5c != node) {
              uVar5 = ref_cavity_insert_seg(ref_cavity,&local_5c);
              if (uVar5 != 0) {
                pcVar15 = "tri side";
                uVar10 = 0x3b1;
                goto LAB_00197f9c;
              }
              pRVar8 = pRVar17->c2n;
              lVar18 = pRVar17->size_per * lVar12;
            }
            local_5c = pRVar8[lVar18];
            local_58 = pRVar8[lVar18 + 1];
            pRVar16 = local_68;
            faceid = (int)local_50;
            if (local_58 != node && local_5c != node) {
              uVar5 = ref_cavity_insert_seg(ref_cavity,&local_5c);
              pRVar16 = local_68;
              faceid = (int)local_50;
              if (uVar5 != 0) {
                pcVar15 = "tri side";
                uVar10 = 0x3b7;
                goto LAB_00197f9c;
              }
            }
          }
        }
        else {
          iVar9 = 0;
          bVar19 = false;
          do {
            while (!bVar19) {
              iVar11 = pRVar17->size_per * iVar1 + iVar9;
              bVar19 = pRVar17->c2n[iVar11] == protect;
              iVar9 = iVar9 + 1;
              if (iVar9 == iVar6) {
                if (pRVar17->c2n[iVar11] != protect) goto LAB_0019797b;
                goto LAB_00197b07;
              }
            }
            iVar9 = iVar9 + 1;
            bVar19 = true;
          } while (iVar9 != iVar6);
        }
LAB_00197b07:
        pRVar3 = pRVar17->ref_adj->item;
        pRVar16 = (REF_CELL)(long)pRVar3[(int)pRVar16].next;
        if (pRVar16 == (REF_CELL)0xffffffffffffffff) goto LAB_00197b2a;
        pRVar3 = pRVar3 + (long)pRVar16;
      } while( true );
    }
    goto LAB_00197b3b;
  }
LAB_00197d04:
  if (ref_cavity->debug != 0) {
    printf("insert form state %d\n",(ulong)ref_cavity->state);
  }
  RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
  if (RVar7 == 0) {
    if (ref_cavity->debug != 0) {
      printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
    }
    RVar7 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar7 == 0) {
      if (ref_cavity->debug == 0) {
        return 0;
      }
      printf("insert seg manifold state %d\n",(ulong)ref_cavity->state);
      return 0;
    }
    pcVar15 = "ball seg manifold";
    uVar10 = 0x3e1;
  }
  else {
    pcVar15 = "ball face manifold";
    uVar10 = 0x3dd;
  }
  uVar5 = 1;
  uVar14 = 1;
LAB_00197f9f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar10,
         "ref_cavity_form_insert",uVar14,pcVar15);
  return uVar5;
LAB_00197b2a:
  lVar12 = local_38;
  site = local_48;
  if (-1 < local_48) {
LAB_00197b3b:
    pRVar17 = ref_grid->cell[8];
    pRVar2 = pRVar17->ref_adj;
    if ((site < pRVar2->nnode) && (lVar12 = (long)pRVar2->first[lVar12], lVar12 != -1)) {
      pRVar3 = pRVar2->item + lVar12;
      local_68 = pRVar17;
      local_50 = lVar12;
LAB_00197b73:
      iVar1 = pRVar3->ref;
      iVar6 = pRVar17->node_per;
      if (0 < iVar6) {
        bVar19 = false;
        iVar9 = 0;
        do {
          while (!bVar19) {
            iVar11 = pRVar17->size_per * iVar1 + iVar9;
            bVar19 = pRVar17->c2n[iVar11] == protect;
            iVar9 = iVar9 + 1;
            if (iVar9 == iVar6) {
              if (pRVar17->c2n[iVar11] != protect) goto LAB_00197bc0;
              goto LAB_00197cc2;
            }
          }
          iVar9 = iVar9 + 1;
          bVar19 = true;
        } while (iVar9 != iVar6);
LAB_00197cc2:
        pRVar3 = pRVar17->ref_adj->item;
        lVar12 = (long)pRVar3[(int)local_50].next;
        if (lVar12 == -1) goto LAB_00197d04;
        pRVar3 = pRVar3 + lVar12;
        local_50 = lVar12;
        goto LAB_00197b73;
      }
LAB_00197bc0:
      uVar5 = ref_list_contains(ref_cavity->tet_list,iVar1,&local_6c);
      if (uVar5 == 0) {
        if (local_6c != 0) {
          pcVar15 = "added tet twice?";
          uVar10 = 0x3c7;
LAB_00197ed1:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar10,"ref_cavity_form_insert",pcVar15);
          return 1;
        }
        uVar5 = ref_list_push(ref_cavity->tet_list,iVar1);
        if (uVar5 != 0) {
          pcVar15 = "save tet";
          uVar10 = 0x3c8;
          goto LAB_00197f9c;
        }
        uVar5 = ref_cell_all_local(local_68,ref_node,iVar1,&local_70);
        if (uVar5 != 0) {
          pcVar15 = "local cell";
          uVar10 = 0x3c9;
          goto LAB_00197f9c;
        }
        if (local_70 == 0) goto LAB_00197ceb;
        iVar6 = local_68->face_per;
        pRVar17 = local_68;
        if (0 < iVar6) {
          lVar18 = 0;
          lVar12 = 0;
          do {
            pRVar8 = pRVar17->c2n;
            iVar9 = pRVar17->size_per;
            pRVar4 = pRVar17->f2n;
            lVar13 = 0;
            do {
              local_44[lVar13] =
                   pRVar8[(long)*(int *)((long)pRVar4 + lVar13 * 4 + lVar18) +
                          (long)iVar9 * (long)iVar1];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (((local_44[0] != node) && (local_44[1] != node)) && (local_44[2] != node)) {
              uVar5 = ref_cavity_insert_face(ref_cavity,local_44);
              if (uVar5 != 0) {
                pcVar15 = "tet side";
                uVar10 = 0x3d6;
                goto LAB_00197f9c;
              }
              iVar6 = local_68->face_per;
              pRVar17 = local_68;
            }
            lVar12 = lVar12 + 1;
            lVar18 = lVar18 + 0x10;
          } while (lVar12 < iVar6);
        }
        goto LAB_00197cc2;
      }
      pcVar15 = "have tet?";
      uVar10 = 0x3c6;
LAB_00197f9c:
      uVar14 = (ulong)uVar5;
      goto LAB_00197f9f;
    }
  }
  goto LAB_00197d04;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert(REF_CAVITY ref_cavity,
                                          REF_GRID ref_grid, REF_INT node,
                                          REF_INT site, REF_INT protect,
                                          REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf("insert form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert seg manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}